

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

void __thiscall IDisk::IDisk(IDisk *this)

{
  long lVar1;
  
  this->_vptr_IDisk = (_func_int **)&PTR__IDisk_001cde88;
  this->nb_sides_ = '\x01';
  lVar1 = 0;
  this->side_[0].nb_tracks = 0;
  this->side_[1].tracks = (MFMTrack *)0x0;
  this->side_[1].nb_tracks = 0;
  (this->current_disk_path_)._M_dataplus._M_p = (pointer)&(this->current_disk_path_).field_2;
  (this->current_disk_path_)._M_string_length = 0;
  (this->current_disk_path_).field_2._M_local_buf[0] = '\0';
  this->load_progress_ = 0xffffffff;
  this->log_ = (ILog *)0x0;
  this->side_[0].tracks = (MFMTrack *)0x0;
  this->head_position_ = 0;
  this->disk_modified_ = false;
  this->fixed_speed_ = false;
  std::__cxx11::string::_M_replace((ulong)&this->current_disk_path_,0,(char *)0x0,0x1a9703);
  this->side_[0].nb_tracks = 0;
  this->side_[0].tracks = (MFMTrack *)0x0;
  this->side_[1].nb_tracks = 0;
  this->side_[1].tracks = (MFMTrack *)0x0;
  mfm_start_of_track_pattern[0] = '\x01';
  mfm_start_of_track_pattern[1] = '\0';
  mfm_start_of_track_pattern[2] = '\x01';
  mfm_start_of_track_pattern[3] = '\0';
  mfm_start_of_track_pattern[4] = '\x01';
  mfm_start_of_track_pattern[5] = '\0';
  mfm_start_of_track_pattern[6] = '\x01';
  mfm_start_of_track_pattern[7] = '\0';
  mfm_start_of_track_pattern[8] = '\x01';
  mfm_start_of_track_pattern[9] = '\0';
  mfm_start_of_track_pattern[10] = '\x01';
  mfm_start_of_track_pattern[0xb] = '\0';
  mfm_start_of_track_pattern[0xc] = '\x01';
  mfm_start_of_track_pattern[0xd] = '\0';
  mfm_start_of_track_pattern[0xe] = '\x01';
  mfm_start_of_track_pattern[0xf] = '\0';
  do {
    mfm_start_of_track_pattern[lVar1 * 2 + 0x10] = '\x01';
    mfm_start_of_track_pattern[lVar1 * 2 + 0x11] = '\0';
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  mfm_start_of_track_pattern[0x20] = '\0';
  mfm_start_of_track_pattern[0x21] = '\x01';
  mfm_start_of_track_pattern[0x22] = '\0';
  mfm_start_of_track_pattern[0x23] = '\x01';
  mfm_start_of_track_pattern[0x24] = '\0';
  mfm_start_of_track_pattern[0x25] = '\0';
  mfm_start_of_track_pattern[0x26] = '\x01';
  mfm_start_of_track_pattern[0x27] = '\0';
  mfm_start_of_track_pattern[0x28] = '\0';
  mfm_start_of_track_pattern[0x29] = '\0';
  mfm_start_of_track_pattern[0x2a] = '\x01';
  mfm_start_of_track_pattern[0x2b] = '\0';
  mfm_start_of_track_pattern[0x2c] = '\0';
  mfm_start_of_track_pattern[0x2d] = '\x01';
  mfm_start_of_track_pattern[0x2e] = '\0';
  mfm_start_of_track_pattern[0x2f] = '\0';
  mfm_start_of_track_pattern[0x30] = '\0';
  mfm_start_of_track_pattern[0x31] = '\x01';
  mfm_start_of_track_pattern[0x32] = '\0';
  mfm_start_of_track_pattern[0x33] = '\x01';
  mfm_start_of_track_pattern[0x34] = '\0';
  mfm_start_of_track_pattern[0x35] = '\0';
  mfm_start_of_track_pattern[0x36] = '\x01';
  mfm_start_of_track_pattern[0x37] = '\0';
  mfm_start_of_track_pattern[0x38] = '\0';
  mfm_start_of_track_pattern[0x39] = '\0';
  mfm_start_of_track_pattern[0x3a] = '\x01';
  mfm_start_of_track_pattern[0x3b] = '\0';
  mfm_start_of_track_pattern[0x3c] = '\0';
  mfm_start_of_track_pattern[0x3d] = '\x01';
  mfm_start_of_track_pattern[0x3e] = '\0';
  mfm_start_of_track_pattern[0x3f] = '\0';
  mfm_start_of_track_pattern[0x40] = '\0';
  mfm_start_of_track_pattern[0x41] = '\x01';
  mfm_start_of_track_pattern[0x42] = '\0';
  mfm_start_of_track_pattern[0x43] = '\x01';
  mfm_start_of_track_pattern[0x44] = '\0';
  mfm_start_of_track_pattern[0x45] = '\0';
  mfm_start_of_track_pattern[0x46] = '\x01';
  mfm_start_of_track_pattern[0x47] = '\0';
  mfm_start_of_track_pattern[0x48] = '\0';
  mfm_start_of_track_pattern[0x49] = '\0';
  mfm_start_of_track_pattern[0x4a] = '\x01';
  mfm_start_of_track_pattern[0x4b] = '\0';
  mfm_start_of_track_pattern[0x4c] = '\0';
  mfm_start_of_track_pattern[0x4d] = '\x01';
  mfm_start_of_track_pattern[0x4e] = '\0';
  mfm_start_of_track_pattern[0x4f] = '\0';
  mfm_start_of_track_pattern2[0] = '\x01';
  mfm_start_of_track_pattern2[1] = '\0';
  mfm_start_of_track_pattern2[2] = '\x01';
  mfm_start_of_track_pattern2[3] = '\0';
  mfm_start_of_track_pattern2[4] = '\x01';
  mfm_start_of_track_pattern2[5] = '\0';
  mfm_start_of_track_pattern2[6] = '\x01';
  mfm_start_of_track_pattern2[7] = '\0';
  mfm_start_of_track_pattern2[8] = '\x01';
  mfm_start_of_track_pattern2[9] = '\0';
  mfm_start_of_track_pattern2[10] = '\x01';
  mfm_start_of_track_pattern2[0xb] = '\0';
  mfm_start_of_track_pattern2[0xc] = '\x01';
  mfm_start_of_track_pattern2[0xd] = '\0';
  mfm_start_of_track_pattern2[0xe] = '\x01';
  mfm_start_of_track_pattern2[0xf] = '\0';
  mfm_start_of_track_pattern[0x50] = '\0';
  mfm_start_of_track_pattern[0x51] = '\x01';
  mfm_start_of_track_pattern[0x52] = '\0';
  mfm_start_of_track_pattern[0x53] = '\x01';
  mfm_start_of_track_pattern[0x54] = '\0';
  mfm_start_of_track_pattern[0x55] = '\x01';
  mfm_start_of_track_pattern[0x56] = '\0';
  mfm_start_of_track_pattern[0x57] = '\x01';
  mfm_start_of_track_pattern[0x58] = '\0';
  mfm_start_of_track_pattern[0x59] = '\x01';
  mfm_start_of_track_pattern[0x5a] = '\0';
  mfm_start_of_track_pattern[0x5b] = '\x01';
  mfm_start_of_track_pattern[0x5c] = '\0';
  mfm_start_of_track_pattern[0x5d] = '\0';
  mfm_start_of_track_pattern[0x5e] = '\x01';
  mfm_start_of_track_pattern[0x5f] = '\0';
  lVar1 = 0;
  do {
    mfm_start_of_track_pattern2[lVar1 * 2 + 0x10] = '\x01';
    mfm_start_of_track_pattern2[lVar1 * 2 + 0x11] = '\0';
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  mfm_start_of_track_pattern2[0x20] = '\0';
  mfm_start_of_track_pattern2[0x21] = '\x01';
  mfm_start_of_track_pattern2[0x22] = '\0';
  mfm_start_of_track_pattern2[0x23] = '\0';
  mfm_start_of_track_pattern2[0x24] = '\0';
  mfm_start_of_track_pattern2[0x25] = '\x01';
  mfm_start_of_track_pattern2[0x26] = '\0';
  mfm_start_of_track_pattern2[0x27] = '\0';
  mfm_start_of_track_pattern2[0x28] = '\x01';
  mfm_start_of_track_pattern2[0x29] = '\0';
  mfm_start_of_track_pattern2[0x2a] = '\0';
  mfm_start_of_track_pattern2[0x2b] = '\0';
  mfm_start_of_track_pattern2[0x2c] = '\x01';
  mfm_start_of_track_pattern2[0x2d] = '\0';
  mfm_start_of_track_pattern2[0x2e] = '\0';
  mfm_start_of_track_pattern2[0x2f] = '\x01';
  mfm_start_of_track_pattern2[0x30] = '\0';
  mfm_start_of_track_pattern2[0x31] = '\x01';
  mfm_start_of_track_pattern2[0x32] = '\0';
  mfm_start_of_track_pattern2[0x33] = '\0';
  mfm_start_of_track_pattern2[0x34] = '\0';
  mfm_start_of_track_pattern2[0x35] = '\x01';
  mfm_start_of_track_pattern2[0x36] = '\0';
  mfm_start_of_track_pattern2[0x37] = '\0';
  mfm_start_of_track_pattern2[0x38] = '\x01';
  mfm_start_of_track_pattern2[0x39] = '\0';
  mfm_start_of_track_pattern2[0x3a] = '\0';
  mfm_start_of_track_pattern2[0x3b] = '\0';
  mfm_start_of_track_pattern2[0x3c] = '\x01';
  mfm_start_of_track_pattern2[0x3d] = '\0';
  mfm_start_of_track_pattern2[0x3e] = '\0';
  mfm_start_of_track_pattern2[0x3f] = '\x01';
  mfm_start_of_track_pattern2[0x40] = '\0';
  mfm_start_of_track_pattern2[0x41] = '\x01';
  mfm_start_of_track_pattern2[0x42] = '\0';
  mfm_start_of_track_pattern2[0x43] = '\0';
  mfm_start_of_track_pattern2[0x44] = '\0';
  mfm_start_of_track_pattern2[0x45] = '\x01';
  mfm_start_of_track_pattern2[0x46] = '\0';
  mfm_start_of_track_pattern2[0x47] = '\0';
  mfm_start_of_track_pattern2[0x48] = '\x01';
  mfm_start_of_track_pattern2[0x49] = '\0';
  mfm_start_of_track_pattern2[0x4a] = '\0';
  mfm_start_of_track_pattern2[0x4b] = '\0';
  mfm_start_of_track_pattern2[0x4c] = '\x01';
  mfm_start_of_track_pattern2[0x4d] = '\0';
  mfm_start_of_track_pattern2[0x4e] = '\0';
  mfm_start_of_track_pattern2[0x4f] = '\x01';
  mfm_start_of_track_pattern2[0x50] = '\0';
  mfm_start_of_track_pattern2[0x51] = '\x01';
  mfm_start_of_track_pattern2[0x52] = '\0';
  mfm_start_of_track_pattern2[0x53] = '\x01';
  mfm_start_of_track_pattern2[0x54] = '\0';
  mfm_start_of_track_pattern2[0x55] = '\x01';
  mfm_start_of_track_pattern2[0x56] = '\0';
  mfm_start_of_track_pattern2[0x57] = '\x01';
  mfm_start_of_track_pattern2[0x58] = '\0';
  mfm_start_of_track_pattern2[0x59] = '\x01';
  mfm_start_of_track_pattern2[0x5a] = '\0';
  mfm_start_of_track_pattern2[0x5b] = '\x01';
  mfm_start_of_track_pattern2[0x5c] = '\0';
  mfm_start_of_track_pattern2[0x5d] = '\x01';
  mfm_start_of_track_pattern2[0x5e] = '\0';
  mfm_start_of_track_pattern2[0x5f] = '\0';
  return;
}

Assistant:

IDisk::IDisk(): nb_sides_(1)
{
   load_progress_ = -1; // No progress by default
   log_ = nullptr;
   fixed_speed_ = false;

   head_position_ = 0;
   disk_modified_ = false;

   current_disk_path_ = "";

   side_[0].nb_tracks = 0;
   side_[0].tracks = nullptr;
   side_[1].nb_tracks = 0;
   side_[1].tracks = nullptr;

   int index_bit = 0;
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0x00);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0x00);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern, index_bit, 0xC2);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern, index_bit, 0xFC);

   index_bit = 0;
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0x00);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0x00);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddSyncByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xA1);
   index_bit = AddByteToTrack(mfm_start_of_track_pattern2, index_bit, 0xFE);

   AddByteToTrack(mfm_gap_4_e, 0, 0x4E);
}